

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void irafswap4(char *string,int nbytes)

{
  char cVar1;
  char cVar2;
  char temp3;
  char temp2;
  char temp1;
  char temp0;
  char *slast;
  char *sbyte;
  int nbytes_local;
  char *string_local;
  
  for (sbyte = string; sbyte < string + nbytes; sbyte = sbyte + 4) {
    cVar1 = *sbyte;
    cVar2 = sbyte[1];
    *sbyte = sbyte[3];
    sbyte[1] = sbyte[2];
    sbyte[2] = cVar2;
    sbyte[3] = cVar1;
  }
  return;
}

Assistant:

static void irafswap4 (

char *string,	/* Address of Integer*4 or Real*4 vector */
int nbytes)	/* Number of bytes to reverse */

{
    char *sbyte, *slast;
    char temp0, temp1, temp2, temp3;

    slast = string + nbytes;
    sbyte = string;
    while (sbyte < slast) {
	temp3 = sbyte[0];
	temp2 = sbyte[1];
	temp1 = sbyte[2];
	temp0 = sbyte[3];
	sbyte[0] = temp0;
	sbyte[1] = temp1;
	sbyte[2] = temp2;
	sbyte[3] = temp3;
	sbyte = sbyte + 4;
	}

    return;
}